

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O1

int __thiscall
helics::zeromq::ZmqCommsSS::initializeBrokerConnections
          (ZmqCommsSS *this,socket_t *brokerSocket,socket_t *brokerConnection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *address;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *psVar7;
  undefined8 uVar8;
  void *in_R8;
  socklen_t in_R9D;
  string_view message;
  size_type *local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode != true)
  goto LAB_002e16db;
  local_88 = (size_type *)CONCAT44(local_88._4_4_,500);
  zmq::detail::socket_base::setsockopt
            (&brokerSocket->super_socket_base,0x11,(int)&local_88,4,in_R8,in_R9D);
  address = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  psVar7 = address;
  bVar4 = bindzmqSocket(brokerSocket,address,
                        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
                        ,(milliseconds)
                         (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.
                         __r,(milliseconds)0xc8);
  if (bVar4) goto LAB_002e16db;
  zmq::socket_t::close(brokerSocket,(int)psVar7);
  LOCK();
  (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
  UNLOCK();
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Unable to bind zmq router socket giving up ","");
  gmlc::networking::makePortAddress
            (&local_68,address,
             (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    uVar8 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_68._M_string_length + local_48._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar8 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_68._M_string_length + local_48._M_string_length) goto LAB_002e1601;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_68,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  else {
LAB_002e1601:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  local_88 = &local_78;
  psVar3 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar1) {
    local_78 = paVar1->_M_allocated_capacity;
    uStack_70 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_78 = paVar1->_M_allocated_capacity;
    local_88 = psVar3;
  }
  local_80 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  message._M_str = (char *)local_88;
  message._M_len = local_80;
  CommsInterface::logError((CommsInterface *)this,message);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
  if (!bVar4) {
    return -1;
  }
LAB_002e16db:
  if ((((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) &&
     (iVar5 = initializeConnectionToBroker(this,brokerConnection), iVar5 != 0)) {
    return -1;
  }
  return 0;
}

Assistant:

int ZmqCommsSS::initializeBrokerConnections(zmq::socket_t& brokerSocket,
                                            zmq::socket_t& brokerConnection)
{
    if (serverMode) {
        brokerSocket.setsockopt(ZMQ_LINGER, 500);
        auto bindsuccess =
            bindzmqSocket(brokerSocket, localTargetAddress, PortNumber, connectionTimeout);
        if (!bindsuccess) {
            brokerSocket.close();
            disconnecting = true;
            logError(std::string("Unable to bind zmq router socket giving up ") +
                     gmlc::networking::makePortAddress(localTargetAddress, PortNumber));
            setRxStatus(ConnectionStatus::ERRORED);
            return -1;
        }
    }
    if (hasBroker) {
        auto ret = initializeConnectionToBroker(brokerConnection);
        if (ret != 0) {
            return ret;
        }
    }
    return 0;
}